

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_tests.c
# Opt level: O0

void C_A_T_C_H_T_E_S_T_12(void)

{
  ExprLhs<int_*const_&> this;
  AssertionHandler catchAssertionHandler_7;
  AssertionHandler catchAssertionHandler_6;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  int *test2;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  Test *test;
  Decomposer *in_stack_fffffffffffff958;
  AssertionHandler *in_stack_fffffffffffff960;
  SourceLineInfo *this_00;
  void **in_stack_fffffffffffff990;
  SourceLineInfo *this_01;
  ExprLhs<Test_*const_&> *in_stack_fffffffffffff998;
  StringRef local_5d8;
  SourceLineInfo local_5c8;
  StringRef local_5b8;
  AssertionHandler local_5a8 [72];
  undefined8 local_560;
  int **local_550;
  StringRef local_518;
  SourceLineInfo local_508;
  StringRef local_4f8;
  AssertionHandler local_4e8 [72];
  undefined8 local_4a0;
  int **local_490;
  StringRef local_458;
  SourceLineInfo local_448;
  StringRef local_438;
  AssertionHandler local_428 [72];
  undefined8 local_3e0;
  int **local_3d0;
  StringRef local_398;
  SourceLineInfo local_388;
  StringRef local_378;
  AssertionHandler local_368 [72];
  undefined8 local_320;
  undefined8 local_318;
  Test **local_308;
  StringRef local_2d0;
  SourceLineInfo local_2c0;
  StringRef local_2b0;
  AssertionHandler local_2a0 [72];
  undefined8 local_258;
  Test **local_248;
  StringRef local_210;
  SourceLineInfo local_200;
  StringRef local_1f0;
  AssertionHandler local_1e0 [72];
  undefined8 local_198;
  Test **local_188;
  StringRef local_150;
  SourceLineInfo local_140;
  StringRef local_130;
  AssertionHandler local_120 [72];
  undefined8 local_d8;
  Test **local_b8;
  StringRef local_80;
  SourceLineInfo local_70;
  StringRef local_60;
  AssertionHandler local_50 [72];
  undefined8 local_8;
  
  local_8 = 0;
  local_60 = operator____catch_sr
                       ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x58);
  Catch::StringRef::StringRef(&local_80,"test == __null");
  Catch::AssertionHandler::AssertionHandler(local_50,&local_60,&local_70,local_80,Normal);
  local_b8 = (Test **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(Test **)0x1b850b);
  local_d8 = 0;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            (in_stack_fffffffffffff998,(long *)in_stack_fffffffffffff990);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_50);
  Catch::BinaryExpr<Test_*const_&,_const_long_&>::~BinaryExpr
            ((BinaryExpr<Test_*const_&,_const_long_&> *)0x1b8574);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_130 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x59);
  Catch::StringRef::StringRef(&local_150,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler(local_120,&local_130,&local_140,local_150,Normal);
  local_188 = (Test **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(Test **)0x1b8688);
  local_198 = 0;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_120);
  Catch::BinaryExpr<Test_*const_&,_const_std::nullptr_t_&>::~BinaryExpr
            ((BinaryExpr<Test_*const_&,_const_std::nullptr_t_&> *)0x1b86eb);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_8 = 0;
  local_1f0 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x5d);
  Catch::StringRef::StringRef(&local_210,"test == __null");
  Catch::AssertionHandler::AssertionHandler(local_1e0,&local_1f0,&local_200,local_210,Normal);
  local_248 = (Test **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(Test **)0x1b8851);
  local_258 = 0;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            (in_stack_fffffffffffff998,(long *)in_stack_fffffffffffff990);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_1e0);
  Catch::BinaryExpr<Test_*const_&,_const_long_&>::~BinaryExpr
            ((BinaryExpr<Test_*const_&,_const_long_&> *)0x1b88b4);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_2b0 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2c0,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x5e);
  Catch::StringRef::StringRef(&local_2d0,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler(local_2a0,&local_2b0,&local_2c0,local_2d0,Normal);
  local_308 = (Test **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(Test **)0x1b8a10);
  local_318 = 0;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_2a0);
  Catch::BinaryExpr<Test_*const_&,_const_std::nullptr_t_&>::~BinaryExpr
            ((BinaryExpr<Test_*const_&,_const_std::nullptr_t_&> *)0x1b8a73);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_320 = 0;
  local_378 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  this_01 = &local_388;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x62);
  Catch::StringRef::StringRef(&local_398,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler(local_368,&local_378,this_01,local_398,Normal);
  this = Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(int **)0x1b8bd9);
  local_3e0 = 0;
  local_3d0 = this.m_lhs;
  Catch::ExprLhs<int*const&>::operator==((ExprLhs<int_*const_&> *)this.m_lhs,(long *)this_01);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_368);
  Catch::BinaryExpr<int_*const_&,_const_long_&>::~BinaryExpr
            ((BinaryExpr<int_*const_&,_const_long_&> *)0x1b8c3c);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_438 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_448,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,99);
  Catch::StringRef::StringRef(&local_458,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler(local_428,&local_438,&local_448,local_458,Normal);
  local_490 = (int **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(int **)0x1b8d98);
  local_4a0 = 0;
  Catch::ExprLhs<int*const&>::operator==((ExprLhs<int_*const_&> *)this.m_lhs,&this_01->file);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_428);
  Catch::BinaryExpr<int_*const_&,_const_std::nullptr_t_&>::~BinaryExpr
            ((BinaryExpr<int_*const_&,_const_std::nullptr_t_&> *)0x1b8dfb);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_320 = 0;
  local_4f8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_508,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x67);
  Catch::StringRef::StringRef(&local_518,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler(local_4e8,&local_4f8,&local_508,local_518,Normal);
  local_550 = (int **)Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(int **)0x1b8f61);
  local_560 = 0;
  Catch::ExprLhs<int*const&>::operator==((ExprLhs<int_*const_&> *)this.m_lhs,(long *)this_01);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_4e8);
  Catch::BinaryExpr<int_*const_&,_const_long_&>::~BinaryExpr
            ((BinaryExpr<int_*const_&,_const_long_&> *)0x1b8fc4);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff960);
  local_5b8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958);
  this_00 = &local_5c8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
             ,0x68);
  Catch::StringRef::StringRef(&local_5d8,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler(local_5a8,&local_5b8,this_00,local_5d8,Normal);
  Catch::Decomposer::operator<=(in_stack_fffffffffffff958,(int **)0x1b9120);
  Catch::ExprLhs<int*const&>::operator==((ExprLhs<int_*const_&> *)this.m_lhs,&this_01->file);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_5a8);
  Catch::BinaryExpr<int_*const_&,_const_std::nullptr_t_&>::~BinaryExpr
            ((BinaryExpr<int_*const_&,_const_std::nullptr_t_&> *)0x1b9183);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_00);
  return;
}

Assistant:

class Test
	{
		Test()
		{
		}
	}